

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamMultiReaderPrivate::SetErrorString
          (BamMultiReaderPrivate *this,string *where,string *what)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::SEPARATOR_abi_cxx11_
      == '\0') {
    iVar1 = __cxa_guard_acquire(&SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::SEPARATOR_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                  SEPARATOR_abi_cxx11_,": ",(allocator *)&local_40);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                    SEPARATOR_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                           SEPARATOR_abi_cxx11_);
    }
  }
  std::operator+(&local_60,where,
                 &SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                  SEPARATOR_abi_cxx11_);
  std::operator+(&local_40,&local_60,what);
  std::__cxx11::string::operator=((string *)&this->m_errorString,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void BamMultiReaderPrivate::SetErrorString(const std::string& where, const std::string& what) const
{
    static const std::string SEPARATOR(": ");
    m_errorString = where + SEPARATOR + what;
}